

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O2

psa_status_t psa_close_key(psa_key_handle_t handle)

{
  psa_status_t pVar1;
  psa_key_slot_t *in_RAX;
  undefined6 in_register_0000003a;
  psa_key_slot_t *slot;
  psa_key_slot_t *local_8;
  
  if ((int)CONCAT62(in_register_0000003a,handle) == 0) {
    pVar1 = 0;
  }
  else {
    local_8 = in_RAX;
    pVar1 = psa_get_key_slot(handle,&local_8);
    if (pVar1 == 0) {
      pVar1 = psa_wipe_key_slot(local_8);
      return pVar1;
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_close_key( psa_key_handle_t handle )
{
    psa_status_t status;
    psa_key_slot_t *slot;

    if( handle == 0 )
        return( PSA_SUCCESS );

    status = psa_get_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    return( psa_wipe_key_slot( slot ) );
}